

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::FormatArg::formatImpl<char[6]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    formatValue<char[6]>(out,fmtBegin,fmtEnd,ntrunc,(char (*) [6])value);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }